

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O3

ssize_t __thiscall
MOS::MOS6522::
MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler>
::read(MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler>
       *this,int __fd,void *__buf,size_t __nbytes)

{
  HalfCycles *pHVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  VIAPortHandler *pVVar6;
  long lVar7;
  byte bVar8;
  undefined8 unaff_RBP;
  undefined7 uVar10;
  ulong uVar9;
  bool bVar11;
  
  access(this,(char *)(ulong)(__fd & 0xfU),(int)__buf);
  uVar10 = (undefined7)((ulong)unaff_RBP >> 8);
  switch(__fd & 0xfU) {
  case 0:
    bVar2 = (this->super_MOS6522Storage).registers_.interrupt_flags;
    bVar3 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar2 & 0xe7;
    bVar11 = (bVar2 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x67) != 0;
    if (bVar3 != bVar11) {
      (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar11;
      pVVar6 = this->bus_handler_;
      lVar7 = (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_;
      (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
      pHVar1 = &pVVar6->audio_->time_since_update;
      (pHVar1->super_WrappedInt<HalfCycles>).length_ =
           (pHVar1->super_WrappedInt<HalfCycles>).length_ + lVar7 * 5;
      Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::
      update_interrupt_input(pVVar6->machine_);
    }
    bVar2 = (this->super_MOS6522Storage).registers_.output[1];
    bVar4 = (this->super_MOS6522Storage).registers_.data_direction[1];
    bVar5 = (this->super_MOS6522Storage).registers_.auxiliary_control;
    pVVar6 = this->bus_handler_;
    lVar7 = (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_;
    (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
    pHVar1 = &pVVar6->audio_->time_since_update;
    (pHVar1->super_WrappedInt<HalfCycles>).length_ =
         (pHVar1->super_WrappedInt<HalfCycles>).length_ + lVar7 * 5;
    bVar8 = Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::
            VIAPortHandler::get_port_input(pVVar6,B);
    uVar9 = CONCAT71(uVar10,(bVar2 ^ bVar8 ^
                            ((this->super_MOS6522Storage).registers_.timer_port_b_output ^ bVar2) &
                            bVar5 & 0x80) & bVar4 ^ bVar8);
    break;
  default:
    bVar2 = (this->super_MOS6522Storage).registers_.interrupt_flags;
    bVar3 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar2 & 0xfc;
    bVar11 = (bVar2 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x7c) != 0;
    if (bVar3 != bVar11) {
      (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar11;
      pVVar6 = this->bus_handler_;
      lVar7 = (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_;
      (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
      pHVar1 = &pVVar6->audio_->time_since_update;
      (pHVar1->super_WrappedInt<HalfCycles>).length_ =
           (pHVar1->super_WrappedInt<HalfCycles>).length_ + lVar7 * 5;
      Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::
      update_interrupt_input(pVVar6->machine_);
    }
    bVar2 = (this->super_MOS6522Storage).registers_.output[0];
    pVVar6 = this->bus_handler_;
    lVar7 = (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_;
    (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
    uVar9 = CONCAT71(uVar10,bVar2 & (this->super_MOS6522Storage).registers_.data_direction[0]);
    pHVar1 = &pVVar6->audio_->time_since_update;
    (pHVar1->super_WrappedInt<HalfCycles>).length_ =
         (pHVar1->super_WrappedInt<HalfCycles>).length_ + lVar7 * 5;
    break;
  case 2:
    uVar9 = CONCAT71(uVar10,(this->super_MOS6522Storage).registers_.data_direction[1]);
    break;
  case 3:
    uVar9 = CONCAT71(uVar10,(this->super_MOS6522Storage).registers_.data_direction[0]);
    break;
  case 4:
    bVar2 = (this->super_MOS6522Storage).registers_.interrupt_flags;
    bVar3 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar2 & 0xbf;
    bVar11 = (bVar2 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x3f) != 0;
    if (bVar3 != bVar11) {
      (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar11;
      pVVar6 = this->bus_handler_;
      lVar7 = (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_;
      (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
      pHVar1 = &pVVar6->audio_->time_since_update;
      (pHVar1->super_WrappedInt<HalfCycles>).length_ =
           (pHVar1->super_WrappedInt<HalfCycles>).length_ + lVar7 * 5;
      Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::
      update_interrupt_input(pVVar6->machine_);
    }
    uVar9 = CONCAT71(uVar10,(char)(this->super_MOS6522Storage).registers_.timer[0]);
    break;
  case 5:
    uVar9 = CONCAT71(uVar10,*(undefined1 *)((long)(this->super_MOS6522Storage).registers_.timer + 1)
                    );
    break;
  case 6:
    uVar9 = CONCAT71(uVar10,(char)(this->super_MOS6522Storage).registers_.timer_latch[0]);
    break;
  case 7:
    uVar9 = CONCAT71(uVar10,*(undefined1 *)
                             ((long)(this->super_MOS6522Storage).registers_.timer_latch + 1));
    break;
  case 8:
    bVar2 = (this->super_MOS6522Storage).registers_.interrupt_flags;
    bVar3 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar2 & 0xdf;
    bVar11 = (bVar2 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x5f) != 0;
    if (bVar3 != bVar11) {
      (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar11;
      pVVar6 = this->bus_handler_;
      lVar7 = (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_;
      (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
      pHVar1 = &pVVar6->audio_->time_since_update;
      (pHVar1->super_WrappedInt<HalfCycles>).length_ =
           (pHVar1->super_WrappedInt<HalfCycles>).length_ + lVar7 * 5;
      Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::
      update_interrupt_input(pVVar6->machine_);
    }
    uVar9 = CONCAT71(uVar10,(char)(this->super_MOS6522Storage).registers_.timer[1]);
    break;
  case 9:
    uVar9 = CONCAT71(uVar10,*(undefined1 *)((long)(this->super_MOS6522Storage).registers_.timer + 3)
                    );
    break;
  case 10:
    (this->super_MOS6522Storage).shift_bits_remaining_ = 8;
    bVar2 = (this->super_MOS6522Storage).registers_.interrupt_flags;
    bVar3 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar2 & 0xfb;
    bVar11 = (bVar2 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x7b) != 0;
    if (bVar3 != bVar11) {
      (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar11;
      pVVar6 = this->bus_handler_;
      lVar7 = (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_;
      (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
      pHVar1 = &pVVar6->audio_->time_since_update;
      (pHVar1->super_WrappedInt<HalfCycles>).length_ =
           (pHVar1->super_WrappedInt<HalfCycles>).length_ + lVar7 * 5;
      Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::
      update_interrupt_input(pVVar6->machine_);
    }
    uVar9 = CONCAT71(uVar10,(this->super_MOS6522Storage).registers_.shift);
    break;
  case 0xb:
    uVar9 = CONCAT71(uVar10,(this->super_MOS6522Storage).registers_.auxiliary_control);
    break;
  case 0xc:
    uVar9 = CONCAT71(uVar10,(this->super_MOS6522Storage).registers_.peripheral_control);
    break;
  case 0xd:
    bVar2 = (this->super_MOS6522Storage).registers_.interrupt_flags;
    uVar9 = CONCAT71(uVar10,(((this->super_MOS6522Storage).registers_.interrupt_enable & bVar2 &
                             0x7f) != 0) << 7 | bVar2);
    break;
  case 0xe:
    uVar9 = CONCAT71(uVar10,(this->super_MOS6522Storage).registers_.interrupt_enable) | 0x80;
  }
  return uVar9 & 0xffffffff;
}

Assistant:

uint8_t MOS6522<T>::read(int address) {
	address &= 0xf;
	access(address);
	switch(address) {
		case 0x0:	// Read Port B ('IRB').
			registers_.interrupt_flags &= ~(InterruptFlag::CB1ActiveEdge | InterruptFlag::CB2ActiveEdge);
			reevaluate_interrupts();
		return get_port_input(Port::B, registers_.data_direction[1], registers_.output[1], registers_.auxiliary_control & 0x80);
		case 0xf:
		case 0x1:	// Read Port A ('IRA').
			registers_.interrupt_flags &= ~(InterruptFlag::CA1ActiveEdge | InterruptFlag::CA2ActiveEdge);
			reevaluate_interrupts();
		return get_port_input(Port::A, registers_.data_direction[0], registers_.output[0], 0);

		case 0x2:	return registers_.data_direction[1];	// Port B direction ('DDRB').
		case 0x3:	return registers_.data_direction[0];	// Port A direction ('DDRA').

		// Timer 1
		case 0x4:	// Timer 1 low-order latches ('T1L-L').
			registers_.interrupt_flags &= ~InterruptFlag::Timer1;
			reevaluate_interrupts();
		return registers_.timer[0] & 0x00ff;
		case 0x5:	return registers_.timer[0] >> 8;			// Timer 1 high-order counter ('T1C-H')
		case 0x6:	return registers_.timer_latch[0] & 0x00ff;	// Timer 1 low-order latches ('T1L-L').
		case 0x7:	return registers_.timer_latch[0] >> 8;		// Timer 1 high-order latches ('T1L-H').

		// Timer 2
		case 0x8:	// Timer 2 low-order counter ('T2C-L').
			registers_.interrupt_flags &= ~InterruptFlag::Timer2;
			reevaluate_interrupts();
		return registers_.timer[1] & 0x00ff;
		case 0x9:	return registers_.timer[1] >> 8;	// Timer 2 high-order counter ('T2C-H').

		case 0xa:	// Shift register ('SR').
			shift_bits_remaining_ = 8;
			registers_.interrupt_flags &= ~InterruptFlag::ShiftRegister;
			reevaluate_interrupts();
		return registers_.shift;

		case 0xb:	return registers_.auxiliary_control;	// Auxiliary control ('ACR').
		case 0xc:	return registers_.peripheral_control;	// Peripheral control ('PCR').

		case 0xd:	return registers_.interrupt_flags | (get_interrupt_line() ? 0x80 : 0x00);	// Interrupt flag register ('IFR').
		case 0xe:	return registers_.interrupt_enable | 0x80;									// Interrupt enable register ('IER').
	}

	return 0xff;
}